

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBlif.c
# Opt level: O1

int Io_ReadBlifNetworkDefaultInputDrive(Io_ReadBlif_t *p,Vec_Ptr_t *vTokens)

{
  void **ppvVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  char *pFoo2;
  char *pFoo1;
  char *local_28;
  char *local_20;
  
  ppvVar1 = vTokens->pArray;
  iVar4 = strncmp((char *)*ppvVar1,".default_input_drive",0x15);
  if (iVar4 != 0) {
    __assert_fail("strncmp( (char *)vTokens->pArray[0], \".default_input_drive\", 21 ) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioReadBlif.c"
                  ,0x488,"int Io_ReadBlifNetworkDefaultInputDrive(Io_ReadBlif_t *, Vec_Ptr_t *)");
  }
  if (vTokens->nSize == 3) {
    dVar2 = strtod((char *)ppvVar1[1],&local_20);
    dVar3 = strtod((char *)vTokens->pArray[2],&local_28);
    if ((*local_20 == '\0') && (*local_28 == '\0')) {
      p->DefInDriRise = (float)dVar2;
      p->DefInDriFall = (float)dVar3;
      p->fHaveDefInDri = 1;
      return 0;
    }
    iVar4 = Extra_FileReaderGetLineNumber(p->pReader,0);
    p->LineCur = iVar4;
    sprintf(p->sError,"Bad value (%s %s) for rise or fall time on .default_input_drive line.",
            vTokens->pArray[1],vTokens->pArray[2]);
  }
  else {
    iVar4 = Extra_FileReaderGetLineNumber(p->pReader,0);
    p->LineCur = iVar4;
    builtin_strncpy(p->sError,"Wrong number of arguments on .default_input_drive line.",0x38);
  }
  Io_ReadBlifPrintErrorMessage(p);
  return 1;
}

Assistant:

int Io_ReadBlifNetworkDefaultInputDrive( Io_ReadBlif_t * p, Vec_Ptr_t * vTokens )
{
    char * pFoo1, * pFoo2;
    double TimeRise, TimeFall;

    // make sure this is indeed the .inputs line
    assert( strncmp( (char *)vTokens->pArray[0], ".default_input_drive", 21 ) == 0 );
    if ( vTokens->nSize != 3 )
    {
        p->LineCur = Extra_FileReaderGetLineNumber(p->pReader, 0);
        sprintf( p->sError, "Wrong number of arguments on .default_input_drive line." );
        Io_ReadBlifPrintErrorMessage( p );
        return 1;
    }
    TimeRise = strtod( (char *)vTokens->pArray[1], &pFoo1 );
    TimeFall = strtod( (char *)vTokens->pArray[2], &pFoo2 );
    if ( *pFoo1 != '\0' || *pFoo2 != '\0' )
    {
        p->LineCur = Extra_FileReaderGetLineNumber(p->pReader, 0);
        sprintf( p->sError, "Bad value (%s %s) for rise or fall time on .default_input_drive line.", (char*)vTokens->pArray[1], (char*)vTokens->pArray[2] );
        Io_ReadBlifPrintErrorMessage( p );
        return 1;
    }
    // set timing info
//    Abc_NtkTimeSetDefaultInputDrive( p->pNtkCur, (float)TimeRise, (float)TimeFall );
    p->DefInDriRise = (float)TimeRise;
    p->DefInDriFall = (float)TimeFall;
    p->fHaveDefInDri = 1;
    return 0;
}